

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

int ExprEval::Operator::get_priority(string *symbol)

{
  pointer __s2;
  size_t __n;
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  
  lVar3 = specification_table[1] - *specification_table;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 7;
    __s2 = (symbol->_M_dataplus)._M_p;
    __n = symbol->_M_string_length;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    puVar2 = (undefined8 *)(*specification_table + 8);
    do {
      if ((puVar2[1] == __n) && ((__n == 0 || (iVar1 = bcmp((void *)*puVar2,__s2,__n), iVar1 == 0)))
         ) {
        return *(int *)(puVar2 + 0xe);
      }
      puVar2 = puVar2 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return -1;
}

Assistant:

int get_priority(const std::string& symbol){
            auto table = specification_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return table->at(i).priority;
            }
            return -1;
        }